

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O2

float orient3d(float *pa,float *pb,float *pc,float *pd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar10 = pd[2];
  fVar16 = pa[2] - fVar10;
  fVar13 = pb[2] - fVar10;
  fVar10 = pc[2] - fVar10;
  fVar14 = (float)*(undefined8 *)pd;
  fVar17 = (float)*(undefined8 *)pa - fVar14;
  fVar15 = (float)((ulong)*(undefined8 *)pd >> 0x20);
  fVar18 = (float)((ulong)*(undefined8 *)pa >> 0x20) - fVar15;
  fVar11 = (float)*(undefined8 *)pb - fVar14;
  fVar12 = (float)((ulong)*(undefined8 *)pb >> 0x20) - fVar15;
  fVar14 = (float)*(undefined8 *)pc - fVar14;
  fVar15 = (float)((ulong)*(undefined8 *)pc >> 0x20) - fVar15;
  fVar19 = fVar12 * fVar14;
  fVar20 = fVar11 * fVar15;
  fVar12 = fVar12 * fVar17;
  fVar11 = fVar11 * fVar18;
  fVar18 = fVar18 * fVar14;
  fVar17 = fVar17 * fVar15;
  fVar14 = (fVar12 - fVar11) * fVar10 + (fVar20 - fVar19) * fVar16 + (fVar18 - fVar17) * fVar13;
  uVar1 = -(uint)(-fVar19 <= fVar19);
  uVar7 = -(uint)(-fVar20 <= fVar20);
  uVar2 = -(uint)(-fVar16 <= fVar16);
  uVar3 = -(uint)(-fVar18 <= fVar18);
  uVar8 = -(uint)(-fVar17 <= fVar17);
  uVar4 = -(uint)(-fVar13 <= fVar13);
  uVar5 = -(uint)(-fVar12 <= fVar12);
  uVar9 = -(uint)(-fVar11 <= fVar11);
  uVar6 = -(uint)(-fVar10 <= fVar10);
  fVar15 = (float)(~uVar6 & (uint)-fVar10 | (uint)fVar10 & uVar6) *
           ((float)(~uVar9 & (uint)-fVar11 | (uint)fVar11 & uVar9) +
           (float)(~uVar5 & (uint)-fVar12 | (uint)fVar12 & uVar5)) +
           (float)(~uVar2 & (uint)-fVar16 | (uint)fVar16 & uVar2) *
           ((float)(~uVar7 & (uint)-fVar20 | (uint)fVar20 & uVar7) +
           (float)(~uVar1 & (uint)-fVar19 | (uint)fVar19 & uVar1)) +
           (float)(~uVar4 & (uint)-fVar13 | (uint)fVar13 & uVar4) *
           ((float)(~uVar8 & (uint)-fVar17 | (uint)fVar17 & uVar8) +
           (float)(~uVar3 & (uint)-fVar18 | (uint)fVar18 & uVar3));
  fVar10 = o3derrboundA * fVar15;
  if ((fVar14 <= fVar10) && (-fVar14 <= fVar10)) {
    fVar10 = orient3dadapt(pa,pb,pc,pd,SUB84((double)fVar15,0));
    return fVar10;
  }
  return fVar14;
}

Assistant:

REAL orient3d(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];
  adz = pa[2] - pd[2];
  bdz = pb[2] - pd[2];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy)
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}